

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O1

size_t OB::String::damerau_levenshtein
                 (string *lhs,string *rhs,size_t weight_insert,size_t weight_substitute,
                 size_t weight_delete,size_t weight_transpose)

{
  undefined1 auVar1 [8];
  pointer puVar2;
  undefined1 auVar3 [8];
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  int iVar8;
  pointer pcVar9;
  string *psVar10;
  string *psVar11;
  undefined8 uVar12;
  string *psVar13;
  unsigned_long uVar14;
  undefined7 uVar16;
  string *psVar15;
  string *psVar17;
  string *psVar18;
  undefined1 *__n;
  string *psVar19;
  string *psVar20;
  ulong uVar21;
  char *pcVar22;
  pointer pcVar23;
  pointer pcVar24;
  string *psVar25;
  string *psVar26;
  size_t sVar27;
  value_type_conflict1 local_108;
  size_t local_100;
  pointer local_f8;
  size_t local_f0;
  string *local_c0;
  long local_b8;
  string *local_b0;
  undefined1 *local_a8;
  size_t local_a0;
  size_t local_98;
  string *local_90;
  string *local_88;
  undefined1 local_80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v1;
  
  psVar17 = (string *)lhs->_M_string_length;
  psVar19 = (string *)rhs->_M_string_length;
  local_100 = weight_substitute;
  local_f0 = weight_transpose;
  local_a0 = weight_insert;
  local_98 = weight_delete;
  if ((psVar17 == psVar19) &&
     ((psVar17 == (string *)0x0 ||
      (iVar8 = bcmp((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,(size_t)psVar17), iVar8 == 0))))
  {
    sVar27 = 0;
  }
  else {
    pcVar24 = (lhs->_M_dataplus)._M_p;
    pcVar23 = (rhs->_M_dataplus)._M_p;
    pcVar9 = pcVar24;
    psVar13 = psVar17;
    psVar25 = psVar19;
    if (psVar19 < psVar17) {
      pcVar9 = pcVar23;
      psVar13 = psVar19;
      pcVar23 = pcVar24;
      psVar25 = psVar17;
    }
    if (psVar13 != (string *)0x0) {
      psVar15 = (string *)0x0;
      do {
        if (psVar25 == psVar15) goto LAB_0012477b;
        psVar10 = psVar13;
        psVar20 = psVar25;
        if (pcVar9[(long)&(psVar15->_M_dataplus)._M_p] !=
            pcVar23[(long)&(psVar15->_M_dataplus)._M_p]) {
          if ((psVar15 != (string *)0x0) && ((psVar13 < psVar15 || (psVar25 < psVar15))))
          goto LAB_001247b7;
          break;
        }
        psVar15 = (string *)((long)&(psVar15->_M_dataplus)._M_p + 1);
      } while (psVar13 != psVar15);
      do {
        psVar20 = (string *)((long)&psVar20[-1].field_2 + 0xf);
        psVar10 = (string *)((long)&psVar10[-1].field_2 + 0xf);
        if (psVar25 <= psVar20) goto LAB_0012477b;
      } while ((pcVar9[(long)&(psVar10->_M_dataplus)._M_p] ==
                pcVar23[(long)&(psVar20->_M_dataplus)._M_p]) && (psVar10 != (string *)0x0));
    }
    pcVar24 = pcVar9;
    rhs = psVar25;
    if (psVar19 < psVar17) {
      pcVar24 = pcVar23;
      rhs = psVar13;
      pcVar23 = pcVar9;
      psVar13 = psVar25;
    }
    if (psVar13 == (string *)0x0) {
      sVar27 = (long)rhs * local_a0;
    }
    else if (rhs == (string *)0x0) {
      sVar27 = (long)psVar13 * local_98;
    }
    else {
      __n = (undefined1 *)((long)&(rhs->_M_dataplus)._M_p + 1);
      v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,(size_type)__n,
                 (value_type_conflict1 *)
                 &v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (allocator_type *)
                 &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(size_type)__n,
                 (value_type_conflict1 *)
                 &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(allocator_type *)&local_108);
      local_108 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(size_type)__n,&local_108,
                 (allocator_type *)
                 ((long)&v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      psVar17 = (string *)
                ((long)v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start -
                 (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage >> 3);
      uVar14 = 0;
      psVar19 = (string *)0x0;
      do {
        psVar25 = rhs;
        if (psVar17 == psVar19) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     psVar17);
          goto LAB_0012475e;
        }
        v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[(long)psVar19] = uVar14;
        psVar19 = (string *)((long)&(psVar19->_M_dataplus)._M_p + 1);
        uVar14 = uVar14 + local_a0;
      } while (psVar19 <= rhs);
      psVar17 = (string *)0x0;
      auVar3 = local_80;
      puVar4 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar5 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar6 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar7 = v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar7;
        v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar6;
        v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar4;
        local_80 = auVar3;
        puVar2 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar6 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        auVar1 = local_80;
        __n = (undefined1 *)
              ((long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start -
               (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage >> 3);
        local_90 = psVar13;
        local_88 = rhs;
        if (v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
            v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0012475e;
        psVar25 = (string *)((long)&(psVar17->_M_dataplus)._M_p + 1);
        *v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (long)psVar25 * local_98;
        local_b8 = (long)v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start -
                   (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage >> 3;
        local_f8 = (pointer)local_80;
        psVar10 = (string *)
                  ((long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start - (long)local_80 >> 3);
        psVar26 = (string *)(local_b8 + (ulong)(local_b8 == 0));
        psVar19 = (string *)((long)&psVar17[-1].field_2 + 0xf);
        psVar20 = (string *)0x1;
        psVar15 = (string *)
                  v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          local_c0 = psVar25;
          local_b0 = psVar10;
          local_a8 = __n;
          if (psVar26 == psVar20) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       psVar20,local_b8);
LAB_001246ce:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001246e3:
            psVar11 = (string *)
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,local_a8);
            psVar18 = local_90;
LAB_0012470b:
            pcVar22 = "basic_string_view::at: __pos (which is %zu) >= this->size() (which is %zu)";
            psVar10 = psVar15;
            psVar20 = psVar11;
            goto LAB_00124712;
          }
          psVar15 = (string *)((long)psVar20 - (long)__n);
          if (psVar15 == (string *)0x1) goto LAB_001246e3;
          if ((string *)(__n + (__n == (undefined1 *)0x0)) == psVar20) goto LAB_001246ce;
          sVar27 = local_100;
          if (pcVar24[(long)&(psVar17->_M_dataplus)._M_p] == (pcVar23 + -1)[(long)psVar20]) {
            sVar27 = 0;
          }
          uVar21 = sVar27 + v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage
                            [(long)&psVar20[-1].field_2._M_allocated_capacity + 0xf];
          if (v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage
              [(long)&psVar20[-1].field_2._M_allocated_capacity + 0xf] + local_a0 <=
              sVar27 + v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage
                       [(long)&psVar20[-1].field_2._M_allocated_capacity + 0xf]) {
            uVar21 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage
                     [(long)&psVar20[-1].field_2._M_allocated_capacity + 0xf] + local_a0;
          }
          if (v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[(long)psVar20] + local_98 <= uVar21) {
            uVar21 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[(long)psVar20] + local_98;
          }
          v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[(long)psVar20] = uVar21;
          uVar16 = (undefined7)(uVar21 >> 8);
          psVar15 = (string *)CONCAT71(uVar16,psVar20 == (string *)0x1);
          if (psVar17 != (string *)0x0 && psVar20 != (string *)0x1) {
            psVar18 = psVar13;
            psVar11 = psVar19;
            if (psVar13 <= psVar19) goto LAB_0012470b;
            psVar15 = (string *)CONCAT71(uVar16,pcVar24[(long)&(psVar19->_M_dataplus)._M_p]);
            if (pcVar24[(long)&(psVar19->_M_dataplus)._M_p] == (pcVar23 + -1)[(long)psVar20]) {
              psVar11 = (string *)((long)&psVar20[-1].field_2 + 0xe);
              psVar18 = rhs;
              if (rhs <= psVar11) goto LAB_0012470b;
              if (pcVar24[(long)&(psVar17->_M_dataplus)._M_p] == (pcVar23 + -2)[(long)psVar20]) {
                if (psVar10 <= psVar20) {
                  do {
                    pcVar22 = 
                    "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
                    psVar18 = psVar10;
LAB_00124712:
                    std::__throw_out_of_range_fmt(pcVar22,psVar20,psVar18);
                  } while( true );
                }
                if (psVar10 <= psVar11) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,(undefined1 *)((long)&psVar20[-1].field_2 + 0xe),psVar10);
                  rhs = psVar26;
                  goto LAB_0012477b;
                }
                uVar21 = *(pointer)((long)local_80 +
                                   ((long)&psVar20[-1].field_2._M_allocated_capacity + 0xe) * 8) +
                         local_f0;
                if (*(ulong *)((long)local_80 + psVar20 * 8) <=
                    *(pointer)((long)local_80 +
                              ((long)&psVar20[-1].field_2._M_allocated_capacity + 0xe) * 8) +
                    local_f0) {
                  uVar21 = *(ulong *)((long)local_80 + psVar20 * 8);
                }
                v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[(long)psVar20] = uVar21;
              }
            }
          }
          psVar15 = (string *)((long)psVar20 + (1 - (long)rhs));
          psVar20 = (string *)((long)&(psVar20->_M_dataplus)._M_p + 1);
        } while (psVar15 != (string *)0x1);
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_80;
        v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        psVar17 = psVar25;
        auVar3 = (undefined1  [8])
                 v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        puVar4 = v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar5 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar2;
        puVar7 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while (psVar25 != psVar13);
      auVar3 = (undefined1  [8])
               v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar4 = v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar5 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar7 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((string *)((long)puVar2 - (long)puVar6 >> 3) <= rhs) goto LAB_00124785;
      sVar27 = puVar6[(long)rhs];
      auVar3 = (undefined1  [8])
               v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar4 = v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar5 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_80 != (undefined1  [8])0x0) {
        uVar21 = (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)local_80;
        local_80 = (undefined1  [8])
                   v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar6;
        v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        operator_delete((void *)auVar1,uVar21);
        auVar3 = local_80;
        puVar4 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar6 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar5 = v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
      v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar6;
      v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar4;
      local_80 = auVar3;
      if (v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,
                        (long)v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (local_80 != (undefined1  [8])0x0) {
        operator_delete((void *)local_80,
                        (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_80);
      }
    }
  }
  return sVar27;
LAB_0012475e:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,__n);
  rhs = psVar25;
LAB_0012477b:
  std::__throw_out_of_range_fmt
            ("basic_string_view::at: __pos (which is %zu) >= this->size() (which is %zu)");
  auVar3 = local_80;
  puVar4 = v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar7 = v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
LAB_00124785:
  v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar7;
  v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar6;
  v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar5;
  v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar4;
  local_80 = auVar3;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",rhs);
LAB_001247b7:
  uVar12 = std::__throw_out_of_range_fmt
                     ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr"
                     );
  if (v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)v1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)v2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_80 != (undefined1  [8])0x0) {
    operator_delete((void *)local_80,
                    (long)v0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_80);
  }
  _Unwind_Resume(uVar12);
}

Assistant:

std::size_t damerau_levenshtein(std::string const& lhs, std::string const& rhs,
  std::size_t const weight_insert, std::size_t const weight_substitute,
  std::size_t const weight_delete, std::size_t const weight_transpose)
{
  if (lhs == rhs)
  {
    return 0;
  }

  std::string_view lhsv {lhs};
  std::string_view rhsv {rhs};

  bool swapped {false};
  if (lhsv.size() > rhsv.size())
  {
    swapped = true;
    std::swap(lhsv, rhsv);
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    if (lhsv.at(i) != rhsv.at(i))
    {
      if (i)
      {
        lhsv.substr(i);
        rhsv.substr(i);
      }

      break;
    }
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    if (lhsv.at(lhsv.size() - 1 - i) != rhsv.at(rhsv.size() - 1 - i))
    {
      if (i)
      {
        lhsv.substr(0, lhsv.size() - 1 - i);
        rhsv.substr(0, rhsv.size() - 1 - i);
      }

      break;
    }
  }

  if (swapped)
  {
    std::swap(lhsv, rhsv);
  }

  if (lhsv.empty())
  {
    return rhsv.size() * weight_insert;
  }

  if (rhsv.empty())
  {
    return lhsv.size() * weight_delete;
  }

  std::vector<std::size_t> v0 (rhsv.size() + 1, 0);
  std::vector<std::size_t> v1 (rhsv.size() + 1, 0);
  std::vector<std::size_t> v2 (rhsv.size() + 1, 0);

  for (std::size_t i = 0; i <= rhsv.size(); ++i)
  {
    v1.at(i) = i * weight_insert;
  }

  for (std::size_t i = 0; i < lhsv.size(); ++i)
  {
    v2.at(0) = (i + 1) * weight_delete;
    for (std::size_t j = 0; j < rhsv.size(); j++)
    {
      v2.at(j + 1) = std::min(
        // deletion
        v1.at(j + 1) + weight_delete,
        std::min(
          // insertion
          v2.at(j) + weight_insert,
          // substitution
          v1.at(j) + (weight_substitute * (lhsv.at(i) != rhsv.at(j)))));

      if (i > 0 && j > 0 &&
        (lhsv.at(i - 1) == rhsv.at(j)) &&
        (lhsv.at(i) == rhsv.at(j - 1)))
      {
        v2.at(j + 1) = std::min(
          v0.at(j + 1),
          // transposition
          v0.at(j - 1) + weight_transpose);
      }
    }

    std::swap(v0, v1);
    std::swap(v1, v2);
  }

  return v1.at(rhsv.size());
}